

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

uint get_tmx_tile_id(vector<Tile_*,_std::allocator<Tile_*>_> *tilemap,int index)

{
  value_type pTVar1;
  reference ppTVar2;
  value_type pTVar3;
  
  ppTVar2 = std::vector<Tile_*,_std::allocator<Tile_*>_>::at(tilemap,(long)index);
  pTVar1 = *ppTVar2;
  pTVar3 = pTVar1->original_tile;
  if (pTVar1->original_tile == (value_type)0x0) {
    pTVar3 = pTVar1;
  }
  return (uint)pTVar1->flipped_y * 0x40000000 +
         ((uint)(byte)~pTVar1->flipped_x << 0x1f | (uint)pTVar3->id) + 0x80000001;
}

Assistant:

unsigned int get_tmx_tile_id(std::vector<Tile *> *tilemap, int index) {
    Tile *t = tilemap->at(index);

    unsigned int id = t->original_tile != NULL ? (unsigned int) t->original_tile->id : (unsigned int) t->id;
    id++;
    if (t->flipped_x) {
        id = id | TMX_FLIP_X_FLAG;
    }
    if (t->flipped_y) {
        id = id | TMX_FLIP_Y_FLAG;
    }

    return id;
}